

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseData.cc
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *in_RDX;
  char *__s;
  char *__s_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  allocator<char> local_71;
  string result;
  string local_50;
  string src_data;
  
  if (argc < 2) {
    __s = (char *)0x0;
    __s_00 = (char *)0x0;
  }
  else {
    __s_00 = argv[1];
    if (argc == 2) {
      __s = (char *)0x0;
    }
    else {
      if (3 < (uint)argc) {
        fwrite("too many positional arguments given\n",0x24,1,_stderr);
        return 1;
      }
      __s = argv[2];
    }
  }
  src_data._M_dataplus._M_p = (pointer)&src_data.field_2;
  src_data._M_string_length = 0;
  src_data.field_2._M_local_buf[0] = '\0';
  if ((__s_00 == (char *)0x0) || ((*__s_00 == '-' && (__s_00[1] == '\0')))) {
    phosg::read_all_abi_cxx11_((string *)&result,_stdin,in_RDX);
    __str = &result;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&src_data,__str);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s_00,&local_71);
    phosg::load_file((string *)&result,&local_50);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&src_data,&result);
    std::__cxx11::string::~string((string *)&result);
    __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50;
  }
  std::__cxx11::string::~string((string *)__str);
  phosg::parse_data_string(&result,&src_data,(string *)0x0,0);
  if ((__s == (char *)0x0) || ((*__s == '-' && (__s[1] == '\0')))) {
    phosg::fwritex(_stdout,(string *)&result);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_71);
    phosg::save_file(&local_50,(string *)&result);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&src_data);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  const char* src_filename = (argc > 1) ? argv[1] : nullptr;
  const char* dst_filename = (argc > 2) ? argv[2] : nullptr;
  if (argc > 3) {
    fprintf(stderr, "too many positional arguments given\n");
    return 1;
  }

  string src_data;
  if (!src_filename || !strcmp(src_filename, "-")) {
    src_data = read_all(stdin);
  } else {
    src_data = load_file(src_filename);
  }

  string result = parse_data_string(src_data);

  if (!dst_filename || !strcmp(dst_filename, "-")) {
    fwritex(stdout, result);
  } else {
    save_file(dst_filename, result);
  }

  return 0;
}